

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O1

redisContext * redisConnectWithOptions(redisOptions *options)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  redisContext *c;
  sds pcVar4;
  redisReader *prVar5;
  
  c = (redisContext *)calloc(1,0xf0);
  if (c == (redisContext *)0x0) {
LAB_00105ec4:
    c = (redisContext *)0x0;
  }
  else {
    c->funcs = &redisContextDefaultFuncs;
    pcVar4 = sdsempty();
    c->obuf = pcVar4;
    prVar5 = redisReaderCreateWithFunctions(&defaultFunctions);
    c->reader = prVar5;
    c->fd = -1;
    if (prVar5 == (redisReader *)0x0 || c->obuf == (char *)0x0) {
      redisFree(c);
      goto LAB_00105ec4;
    }
  }
  if (c == (redisContext *)0x0) {
LAB_00105f1b:
    c = (redisContext *)0x0;
  }
  else {
    uVar2 = options->options;
    if ((uVar2 & 1) == 0) {
      *(byte *)&c->flags = (byte)c->flags | 1;
    }
    if ((uVar2 & 2) != 0) {
      *(byte *)&c->flags = (byte)c->flags | 0x80;
    }
    if ((uVar2 & 4) != 0) {
      pbVar1 = (byte *)((long)&c->flags + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    iVar3 = options->type;
    if (iVar3 == 2) {
      c->fd = (options->endpoint).fd;
      *(byte *)&c->flags = (byte)c->flags | 2;
    }
    else if (iVar3 == 1) {
      redisContextConnectUnix(c,(options->endpoint).tcp.source_addr,options->timeout);
    }
    else {
      if (iVar3 != 0) goto LAB_00105f1b;
      redisContextConnectBindTcp
                (c,(options->endpoint).tcp.ip,(options->endpoint).tcp.port,options->timeout,
                 (options->endpoint).tcp.source_addr);
    }
    if (((options->timeout != (timeval *)0x0) && ((c->flags & 1) != 0)) && (c->fd != -1)) {
      redisContextSetTimeout(c,*options->timeout);
    }
  }
  return c;
}

Assistant:

redisContext *redisConnectWithOptions(const redisOptions *options) {
    redisContext *c = redisContextInit(options);
    if (c == NULL) {
        return NULL;
    }
    if (!(options->options & REDIS_OPT_NONBLOCK)) {
        c->flags |= REDIS_BLOCK;
    }
    if (options->options & REDIS_OPT_REUSEADDR) {
        c->flags |= REDIS_REUSEADDR;
    }
    if (options->options & REDIS_OPT_NOAUTOFREE) {
      c->flags |= REDIS_NO_AUTO_FREE;
    }

    if (options->type == REDIS_CONN_TCP) {
        redisContextConnectBindTcp(c, options->endpoint.tcp.ip,
                                   options->endpoint.tcp.port, options->timeout,
                                   options->endpoint.tcp.source_addr);
    } else if (options->type == REDIS_CONN_UNIX) {
        redisContextConnectUnix(c, options->endpoint.unix_socket,
                                options->timeout);
    } else if (options->type == REDIS_CONN_USERFD) {
        c->fd = options->endpoint.fd;
        c->flags |= REDIS_CONNECTED;
    } else {
        // Unknown type - FIXME - FREE
        return NULL;
    }
    if (options->timeout != NULL && (c->flags & REDIS_BLOCK) && c->fd != REDIS_INVALID_FD) {
        redisContextSetTimeout(c, *options->timeout);
    }
    return c;
}